

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5SegIterReverseInitPage(Fts5Index *p,Fts5SegIter *pIter)

{
  int iVar1;
  u8 *puVar2;
  int iVar3;
  byte bVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  long in_FS_OFFSET;
  u64 iDelta;
  u64 local_48;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = p->pConfig->eDetail;
  iVar10 = pIter->pLeaf->szLeaf;
  iVar9 = (int)pIter->iLeafOffset;
  iVar3 = pIter->iEndofDoclist;
  if (iVar10 < pIter->iEndofDoclist) {
    iVar3 = iVar10;
  }
  puVar2 = pIter->pLeaf->p;
  iVar10 = 0;
  do {
    local_48 = 0;
    if (iVar1 == 1) {
      iVar6 = iVar9;
      if ((iVar9 < iVar3) && (puVar2[iVar9] == '\0')) {
        lVar7 = (long)iVar9 + 1;
        iVar5 = (int)lVar7;
        iVar6 = iVar5;
        if ((iVar5 < iVar3) && (iVar6 = iVar9 + 2, puVar2[lVar7] != '\0')) {
          iVar6 = iVar5;
        }
      }
    }
    else {
      local_3c = (uint)puVar2[iVar9];
      iVar6 = 1;
      if ((char)puVar2[iVar9] < '\0') {
        iVar6 = sqlite3Fts5GetVarint32(puVar2 + iVar9,&local_3c);
      }
      iVar6 = iVar6 + iVar9 + (int)local_3c / 2;
    }
    iVar5 = 3;
    iVar9 = iVar6;
    if (iVar6 < iVar3) {
      bVar4 = sqlite3Fts5GetVarint(puVar2 + iVar6,&local_48);
      pIter->iRowid = pIter->iRowid + local_48;
      iVar9 = (uint)bVar4 + iVar6;
      if (pIter->nRowidOffset <= iVar10) {
        lVar7 = (long)pIter->nRowidOffset + 8;
        piVar8 = pIter->aRowidOffset;
        iVar6 = sqlite3_initialize();
        if (iVar6 == 0) {
          piVar8 = (int *)sqlite3Realloc(piVar8,lVar7 * 4);
        }
        else {
          piVar8 = (int *)0x0;
        }
        if (piVar8 == (int *)0x0) {
          p->rc = 7;
          iVar5 = 3;
          goto LAB_001e2faf;
        }
        pIter->aRowidOffset = piVar8;
        pIter->nRowidOffset = (int)lVar7;
      }
      lVar7 = (long)iVar10;
      iVar10 = iVar10 + 1;
      pIter->aRowidOffset[lVar7] = (int)pIter->iLeafOffset;
      pIter->iLeafOffset = (long)iVar9;
      iVar5 = 0;
    }
LAB_001e2faf:
    if (iVar5 != 0) {
      pIter->iRowidOffset = iVar10;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        fts5SegIterLoadNPos(p,pIter);
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

static void fts5SegIterReverseInitPage(Fts5Index *p, Fts5SegIter *pIter){
  int eDetail = p->pConfig->eDetail;
  int n = pIter->pLeaf->szLeaf;
  int i = pIter->iLeafOffset;
  u8 *a = pIter->pLeaf->p;
  int iRowidOffset = 0;

  if( n>pIter->iEndofDoclist ){
    n = pIter->iEndofDoclist;
  }

  ASSERT_SZLEAF_OK(pIter->pLeaf);
  while( 1 ){
    u64 iDelta = 0;

    if( eDetail==FTS5_DETAIL_NONE ){
      /* todo */
      if( i<n && a[i]==0 ){
        i++;
        if( i<n && a[i]==0 ) i++;
      }
    }else{
      int nPos;
      int bDummy;
      i += fts5GetPoslistSize(&a[i], &nPos, &bDummy);
      i += nPos;
    }
    if( i>=n ) break;
    i += fts5GetVarint(&a[i], &iDelta);
    pIter->iRowid += iDelta;

    /* If necessary, grow the pIter->aRowidOffset[] array. */
    if( iRowidOffset>=pIter->nRowidOffset ){
      int nNew = pIter->nRowidOffset + 8;
      int *aNew = (int*)sqlite3_realloc64(pIter->aRowidOffset,nNew*sizeof(int));
      if( aNew==0 ){
        p->rc = SQLITE_NOMEM;
        break;
      }
      pIter->aRowidOffset = aNew;
      pIter->nRowidOffset = nNew;
    }

    pIter->aRowidOffset[iRowidOffset++] = pIter->iLeafOffset;
    pIter->iLeafOffset = i;
  }
  pIter->iRowidOffset = iRowidOffset;
  fts5SegIterLoadNPos(p, pIter);
}